

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip39.c
# Opt level: O0

int bip39_mnemonic_from_bytes(words *w,uchar *bytes,size_t bytes_len,char **output)

{
  size_t mask_00;
  size_t sVar1;
  char *pcVar2;
  words *local_80;
  size_t mask;
  size_t checksum;
  uchar tmp_bytes [42];
  char **output_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  words *w_local;
  
  if (output != (char **)0x0) {
    *output = (char *)0x0;
  }
  if (((bytes == (uchar *)0x0) || (bytes_len == 0)) || (output == (char **)0x0)) {
    w_local._4_4_ = -2;
  }
  else {
    local_80 = w;
    if (w == (words *)0x0) {
      local_80 = &en_words;
    }
    if ((local_80->bits == 0xb) && (mask_00 = len_to_mask(bytes_len), mask_00 != 0)) {
      memcpy(&checksum,bytes,bytes_len);
      sVar1 = bip39_checksum(bytes,bytes_len,mask_00);
      tmp_bytes[bytes_len - 8] = (uchar)sVar1;
      output_local = (char **)bytes_len;
      if (0xff < mask_00) {
        output_local = (char **)(bytes_len + 1);
        tmp_bytes[bytes_len - 7] = (uchar)(sVar1 >> 8);
      }
      pcVar2 = mnemonic_from_bytes(local_80,(uchar *)&checksum,(long)output_local + 1);
      *output = pcVar2;
      wally_clear(&checksum,0x2a);
      w_local._4_4_ = -3;
      if (*output != (char *)0x0) {
        w_local._4_4_ = 0;
      }
    }
    else {
      w_local._4_4_ = -2;
    }
  }
  return w_local._4_4_;
}

Assistant:

int bip39_mnemonic_from_bytes(const struct words *w,
                              const unsigned char *bytes, size_t bytes_len,
                              char **output)
{
    unsigned char tmp_bytes[BIP39_ENTROPY_LEN_MAX];
    size_t checksum, mask;

    if (output)
        *output = NULL;

    if (!bytes || !bytes_len || !output)
        return WALLY_EINVAL;

    w = w ? w : &en_words;

    if (w->bits != 11u || !(mask = len_to_mask(bytes_len)))
        return WALLY_EINVAL;

    memcpy(tmp_bytes, bytes, bytes_len);
    checksum = bip39_checksum(bytes, bytes_len, mask);
    tmp_bytes[bytes_len] = checksum & 0xff;
    if (mask > 0xff)
        tmp_bytes[++bytes_len] = (checksum >> 8) & 0xff;
    *output = mnemonic_from_bytes(w, tmp_bytes, bytes_len + 1);
    wally_clear(tmp_bytes, sizeof(tmp_bytes));
    return *output ? WALLY_OK : WALLY_ENOMEM;
}